

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::NameSyntax> *args_1;
  SyntaxNode *args_4;
  EdgeSensitivePathSuffixSyntax *pEVar1;
  DeepCloneVisitor visitor;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::NameSyntax>
                     ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x80),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x88),(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EdgeSensitivePathSuffixSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_70,args_1,&local_40,&local_50,
                      (ExpressionSyntax *)args_4,&local_60);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EdgeSensitivePathSuffixSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EdgeSensitivePathSuffixSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone(node.outputs, alloc),
        node.polarityOperator.deepClone(alloc),
        node.colon.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc)
    );
}